

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,_5,_10,_15,_3U>::construct(int sign,int exponent,StorageType mantissa)

{
  ushort uVar1;
  undefined6 in_register_00000012;
  
  uVar1 = 0;
  if (((int)CONCAT62(in_register_00000012,mantissa) != 0 || exponent != 0) &&
     (uVar1 = 0, exponent != -0xe || 0x3ff < mantissa)) {
    uVar1 = (short)exponent * 0x400 + 0x3c00;
  }
  return (Float<unsigned_short,_5,_10,_15,_3U>)
         (mantissa & 0x3ff | uVar1 | (ushort)((uint)sign >> 0x10) & 0x8000);
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::construct
	(int sign, int exponent, StorageType mantissa)
{
	// Repurpose this otherwise invalid input as a shorthand notation for zero (no need for caller to care about internal representation)
	const bool			isShorthandZero	= exponent == 0 && mantissa == 0;

	// Handles the typical notation for zero (min exponent, mantissa 0). Note that the exponent usually used exponent (-ExponentBias) for zero/subnormals is not used.
	// Instead zero/subnormals have the (normally implicit) leading mantissa bit set to zero.
	const bool			isDenormOrZero	= (exponent == 1 - ExponentBias) && (mantissa >> MantissaBits == 0);
	const StorageType	s				= StorageType((StorageType(sign < 0 ? 1 : 0)) << (StorageType(ExponentBits+MantissaBits)));
	const StorageType	exp				= (isShorthandZero  || isDenormOrZero) ? StorageType(0) : StorageType(exponent + ExponentBias);

	DE_ASSERT(sign == +1 || sign == -1);
	DE_ASSERT(isShorthandZero || isDenormOrZero || mantissa >> MantissaBits == 1);
	DE_ASSERT(exp >> ExponentBits == 0);

	return Float(StorageType(s | (exp << MantissaBits) | (mantissa & ((StorageType(1)<<MantissaBits)-1))));
}